

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_runner.cpp
# Opt level: O0

void __thiscall
duckdb::SQLLogicTestRunner::LoadDatabase
          (SQLLogicTestRunner *this,string *dbpath,bool load_extensions)

{
  bool bVar1;
  type pDVar2;
  reference pbVar3;
  byte in_DL;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extension;
  iterator __end2;
  iterator __begin2;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  AssertionHandler catchAssertionHandler;
  ErrorData err;
  exception *ex;
  pointer in_stack_fffffffffffffda8;
  unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>_> *in_stack_fffffffffffffdb0;
  value_type *in_stack_fffffffffffffdb8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdc0;
  DBConfig **in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1f8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1f0;
  long local_1e8;
  SQLLogicTestRunner *in_stack_ffffffffffffff00;
  allocator local_59;
  string local_58 [48];
  pointer local_28;
  byte local_11;
  
  local_11 = in_DL & 1;
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>::reset
            ((unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true> *)
             in_stack_fffffffffffffdb0,(pointer)in_stack_fffffffffffffda8);
  unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::reset
            ((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *)
             in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>_>_>_>
  ::clear((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>_>_>_>
           *)0x7c03d8);
  local_28 = std::unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>_>::get
                       (in_stack_fffffffffffffdb0);
  make_uniq<duckdb::DuckDB,std::__cxx11::string&,duckdb::DBConfig*>
            (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>::operator=
            ((unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true> *)
             in_stack_fffffffffffffdb0,
             (unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true> *)
             in_stack_fffffffffffffda8);
  unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>::~unique_ptr
            ((unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true> *)0x7c0434);
  pDVar2 = unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>::operator*
                     ((unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true> *)
                      in_stack_fffffffffffffdb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"core_functions",&local_59);
  duckdb::ExtensionHelper::LoadExtension(pDVar2,local_58);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  Reconnect(in_stack_ffffffffffffff00);
  if ((local_11 & 1) != 0) {
    local_1e8 = in_RDI + 0x58;
    local_1f0._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffda8);
    local_1f8._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffda8);
    while (bVar1 = std::__detail::operator!=(&local_1f0,&local_1f8), bVar1) {
      pbVar3 = std::__detail::
               _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
               ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                            *)0x7c0747);
      pDVar2 = unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>::operator*
                         ((unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true> *)
                          in_stack_fffffffffffffdb0);
      duckdb::ExtensionHelper::LoadExtension(pDVar2,(string *)pbVar3);
      std::__detail::
      _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
      ::operator++((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                    *)in_stack_fffffffffffffdb0);
    }
  }
  return;
}

Assistant:

void SQLLogicTestRunner::LoadDatabase(string dbpath, bool load_extensions) {
	loaded_databases.push_back(dbpath);

	// restart the database with the specified db path
	db.reset();
	con.reset();
	named_connection_map.clear();
	// now re-open the current database

	try {
		db = make_uniq<DuckDB>(dbpath, config.get());
		// always load core functions
		ExtensionHelper::LoadExtension(*db, "core_functions");
	} catch (std::exception &ex) {
		ErrorData err(ex);
		SQLLogicTestLogger::LoadDatabaseFail(dbpath, err.Message());
		FAIL();
	}
	Reconnect();

	// load any previously loaded extensions again
	if (load_extensions) {
		for (auto &extension : extensions) {
			ExtensionHelper::LoadExtension(*db, extension);
		}
	}
}